

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Linear_Object_State_PDU.cpp
# Opt level: O3

void __thiscall
KDIS::PDU::Linear_Object_State_PDU::Encode(Linear_Object_State_PDU *this,KDataStream *stream)

{
  pointer pLVar1;
  pointer pLVar2;
  
  Object_State_Header::Encode(&this->super_Object_State_Header,stream);
  KDataStream::Write(stream,(this->super_Object_State_Header).field_0x4b);
  (*(this->m_ReqID).super_DataTypeBase._vptr_DataTypeBase[5])(&this->m_ReqID,stream);
  (*(this->m_RecvID).super_DataTypeBase._vptr_DataTypeBase[5])(&this->m_RecvID,stream);
  (*(this->m_ObjTyp).super_DataTypeBase._vptr_DataTypeBase[5])(&this->m_ObjTyp,stream);
  pLVar1 = (this->m_vSegments).
           super__Vector_base<KDIS::DATA_TYPE::LinearSegmentParameter,_std::allocator<KDIS::DATA_TYPE::LinearSegmentParameter>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pLVar2 = (this->m_vSegments).
                super__Vector_base<KDIS::DATA_TYPE::LinearSegmentParameter,_std::allocator<KDIS::DATA_TYPE::LinearSegmentParameter>_>
                ._M_impl.super__Vector_impl_data._M_start; pLVar2 != pLVar1; pLVar2 = pLVar2 + 1) {
    (*(pLVar2->super_DataTypeBase)._vptr_DataTypeBase[5])(pLVar2,stream);
  }
  return;
}

Assistant:

void Linear_Object_State_PDU::Encode( KDataStream & stream ) const
{
    Object_State_Header::Encode( stream );

    stream << m_ui8NumSegment
           << KDIS_STREAM m_ReqID
           << KDIS_STREAM m_RecvID
           << KDIS_STREAM m_ObjTyp;

    vector<LinearSegmentParameter>::const_iterator citr = m_vSegments.begin();
    std::vector<LinearSegmentParameter>::const_iterator citrEnd = m_vSegments.end();
    for( ; citr != citrEnd; ++citr )
    {
        citr->Encode( stream );
    }
}